

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O0

void __thiscall TextFile::writeFormat<char*>(TextFile *this,wchar_t *text,char **args)

{
  size_t in_RCX;
  void *__buf;
  wstring local_40 [8];
  wstring message;
  char **args_local;
  wchar_t *text_local;
  TextFile *this_local;
  
  formatString<char*>((wchar_t *)local_40,(char **)text);
  write(this,(int)local_40,__buf,in_RCX);
  std::__cxx11::wstring::~wstring(local_40);
  return;
}

Assistant:

void writeFormat(const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		write(message);
	}